

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tables.cpp
# Opt level: O1

void __thiscall MT32Emu::Tables::Tables(Tables *this)

{
  long lVar1;
  Bit8u BVar2;
  int iVar3;
  Bit8u *pBVar4;
  int lf;
  long lVar5;
  float fVar6;
  double dVar7;
  
  lVar5 = 0;
  do {
    dVar7 = log10((double)((float)(int)lVar5 + 1.0));
    iVar3 = (int)((2.0 - (float)dVar7) * 128.0 + 1.0);
    BVar2 = (Bit8u)iVar3;
    if (0xfe < iVar3) {
      BVar2 = 0xff;
    }
    this->levelToAmpSubtraction[lVar5] = BVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x65);
  this->envLogarithmicTime[0] = '@';
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    dVar7 = log((double)(int)lVar1);
    fVar6 = ceilf((float)(dVar7 / 0.6931471824645996) * 8.0 + 64.0);
    this->envLogarithmicTime[lVar5 + 1] = (Bit8u)(int)fVar6;
    lVar5 = lVar1;
  } while (lVar1 != 0xff);
  this->masterVolToAmpSubtraction[0] = 0xff;
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    dVar7 = log((double)(int)lVar1);
    this->masterVolToAmpSubtraction[lVar5 + 1] =
         (Bit8u)(int)((float)(dVar7 / -0.6931471824645996) * 16.0 + 106.31);
    lVar5 = lVar1;
  } while (lVar1 != 100);
  pBVar4 = this->pulseWidth100To255;
  lVar5 = 0;
  do {
    *pBVar4 = (Bit8u)(int)((float)(int)lVar5 / 100.0 + 0.5);
    lVar5 = lVar5 + 0xff;
    pBVar4 = pBVar4 + 1;
  } while (lVar5 != 0x649b);
  iVar3 = -1;
  lVar5 = 0;
  do {
    dVar7 = exp((double)(((float)iVar3 * 0.001953125 + 13.0) * 0.6931472));
    this->exp9[lVar5] = (Bit16u)(int)(8191.5 - (float)dVar7);
    lVar5 = lVar5 + 1;
    iVar3 = iVar3 + -1;
  } while (lVar5 != 0x200);
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    dVar7 = sin((double)(((float)(int)lVar1 + 0.5) * 0.0009765625 * 3.1415927));
    dVar7 = log((double)(float)dVar7);
    this->logsin9[lVar5 + 1] = (Bit16u)(int)((float)(dVar7 / -0.6931471824645996) * 1024.0 + 0.5);
    lVar5 = lVar1;
  } while (lVar1 != 0x1ff);
  this->logsin9[0] = 0x1fff;
  this->resAmpDecayFactor = "\x1f\x10\f\b\x05\x03\x02\x01";
  return;
}

Assistant:

Tables::Tables() {
	for (int lf = 0; lf <= 100; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		float fVal = (2.0f - LOG10F(float(lf) + 1.0f)) * 128.0f;
		int val = int(fVal + 1.0);
		if (val > 255) {
			val = 255;
		}
		levelToAmpSubtraction[lf] = Bit8u(val);
	}

	envLogarithmicTime[0] = 64;
	for (int lf = 1; lf <= 255; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		envLogarithmicTime[lf] = Bit8u(ceil(64.0f + LOG2F(float(lf)) * 8.0f));
	}

#if 0
	// The table below is to be used in conjunction with emulation of VCA of newer generation units which is currently missing.
	// These relatively small values are rather intended to fine-tune the overall amplification of the VCA.
	// CONFIRMED: Based on a table found by Mok in the LAPC-I control ROM
	// Note that this matches the MT-32 table, but with the values clamped to a maximum of 8.
	memset(masterVolToAmpSubtraction, 8, 71);
	memset(masterVolToAmpSubtraction + 71, 7, 3);
	memset(masterVolToAmpSubtraction + 74, 6, 4);
	memset(masterVolToAmpSubtraction + 78, 5, 3);
	memset(masterVolToAmpSubtraction + 81, 4, 4);
	memset(masterVolToAmpSubtraction + 85, 3, 3);
	memset(masterVolToAmpSubtraction + 88, 2, 4);
	memset(masterVolToAmpSubtraction + 92, 1, 4);
	memset(masterVolToAmpSubtraction + 96, 0, 5);
#else
	// CONFIRMED: Based on a table found by Mok in the MT-32 control ROM
	masterVolToAmpSubtraction[0] = 255;
	for (int masterVol = 1; masterVol <= 100; masterVol++) {
		masterVolToAmpSubtraction[masterVol] = Bit8u(106.31 - 16.0f * LOG2F(float(masterVol)));
	}
#endif

	for (int i = 0; i <= 100; i++) {
		pulseWidth100To255[i] = Bit8u(i * 255 / 100.0f + 0.5f);
		//synth->printDebug("%d: %d", i, pulseWidth100To255[i]);
	}

	// The LA32 chip contains an exponent table inside. The table contains 12-bit integer values.
	// The actual table size is 512 rows. The 9 higher bits of the fractional part of the argument are used as a lookup address.
	// To improve the precision of computations, the lower bits are supposed to be used for interpolation as the LA32 chip also
	// contains another 512-row table with inverted differences between the main table values.
	for (int i = 0; i < 512; i++) {
		exp9[i] = Bit16u(8191.5f - EXP2F(13.0f + ~i / 512.0f));
	}

	// There is a logarithmic sine table inside the LA32 chip. The table contains 13-bit integer values.
	for (int i = 1; i < 512; i++) {
		logsin9[i] = Bit16u(0.5f - LOG2F(sin((i + 0.5f) / 1024.0f * FLOAT_PI)) * 1024.0f);
	}

	// The very first value is clamped to the maximum possible 13-bit integer
	logsin9[0] = 8191;

	// found from sample analysis
	static const Bit8u resAmpDecayFactorTable[] = {31, 16, 12, 8, 5, 3, 2, 1};
	resAmpDecayFactor = resAmpDecayFactorTable;
}